

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

void ngx_create_hashed_filename(ngx_path_t *path,u_char *file,size_t len)

{
  size_t __n;
  ulong local_38;
  ngx_uint_t n;
  size_t level;
  size_t i;
  size_t len_local;
  u_char *file_local;
  ngx_path_t *path_local;
  
  level = (path->name).len + 1;
  file[(path->name).len + path->len] = '/';
  i = len;
  for (local_38 = 0; (local_38 < 3 && (__n = path->level[local_38], __n != 0));
      local_38 = local_38 + 1) {
    i = i - __n;
    file[level - 1] = '/';
    memcpy(file + level,file + i,__n);
    level = __n + 1 + level;
  }
  return;
}

Assistant:

void
ngx_create_hashed_filename(ngx_path_t *path, u_char *file, size_t len)
{
    size_t      i, level;
    ngx_uint_t  n;

    i = path->name.len + 1;

    file[path->name.len + path->len]  = '/';

    for (n = 0; n < NGX_MAX_PATH_LEVEL; n++) {
        level = path->level[n];

        if (level == 0) {
            break;
        }

        len -= level;
        file[i - 1] = '/';
        ngx_memcpy(&file[i], &file[len], level);
        i += level + 1;
    }
}